

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix3d>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *result)

{
  pointer *ppmVar1;
  pointer pmVar2;
  StreamReader *pSVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  _Alloc_hider _Var9;
  iterator iVar10;
  byte bVar11;
  matrix3d value;
  char c;
  undefined1 local_98 [32];
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double local_58;
  string local_50;
  
  bVar11 = 0;
  pmVar2 = (result->
           super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>).
      _M_impl.super__Vector_impl_data._M_finish != pmVar2) {
    (result->
    super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>).
    _M_impl.super__Vector_impl_data._M_finish = pmVar2;
  }
  bVar4 = SkipWhitespaceAndNewline(this,true);
  if (!bVar4) {
    return false;
  }
  local_98._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x3ff0000000000000;
  local_98._8_8_ = 0.0;
  local_98._16_8_ = 0.0;
  local_98._24_8_ = 0.0;
  local_78 = 1.0;
  local_70 = 0.0;
  dStack_68 = 0.0;
  local_60 = 0.0;
  local_58 = 1.0;
  bVar4 = ParseMatrix(this,(matrix3d *)local_98);
  if (bVar4) {
    iVar10._M_current =
         (result->
         super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar10._M_current ==
        (result->
        super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>::
      _M_realloc_insert<tinyusdz::value::matrix3d_const&>
                ((vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>> *)
                 result,iVar10,(matrix3d *)local_98);
    }
    else {
      pdVar8 = (double *)local_98;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        (iVar10._M_current)->m[0][0] = *pdVar8;
        pdVar8 = pdVar8 + (ulong)bVar11 * -2 + 1;
        iVar10._M_current = (matrix3d *)((long)iVar10._M_current + ((ulong)bVar11 * -2 + 1) * 8);
      }
      ppmVar1 = &(result->
                 super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppmVar1 = *ppmVar1 + 1;
    }
    do {
      pSVar3 = this->_sr;
      if ((pSVar3->length_ <= pSVar3->idx_) || (pSVar3->binary_[pSVar3->idx_] == '\0'))
      goto LAB_003b7dc0;
      bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar4) {
        return false;
      }
      bVar4 = Char1(this,(char *)&local_50);
      if (!bVar4) {
        return false;
      }
      if ((char)local_50._M_dataplus._M_p == sep) {
        bVar4 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar4) {
          return false;
        }
        bVar4 = LookChar1(this,local_98);
        if (!bVar4) {
          return false;
        }
        iVar5 = 3;
        if (local_98[0] != (string)end_symbol) {
          goto LAB_003b7d11;
        }
      }
      else {
LAB_003b7d11:
        if ((char)local_50._M_dataplus._M_p != sep) {
          pSVar3 = this->_sr;
          if ((0 < (long)pSVar3->idx_) && (uVar7 = pSVar3->idx_ - 1, uVar7 <= pSVar3->length_)) {
            pSVar3->idx_ = uVar7;
          }
          goto LAB_003b7dc0;
        }
        bVar4 = SkipWhitespaceAndNewline(this,true);
        if (!bVar4) {
          return false;
        }
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3ff0000000000000;
        local_98._24_8_ = 0.0;
        local_98._8_8_ = 0.0;
        local_98._16_8_ = 0.0;
        local_78 = 1.0;
        local_60 = 0.0;
        local_70 = 0.0;
        dStack_68 = 0.0;
        local_58 = 1.0;
        bVar4 = ParseMatrix(this,(matrix3d *)local_98);
        iVar5 = 3;
        if (bVar4) {
          iVar10._M_current =
               (result->
               super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (result->
              super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>::
            _M_realloc_insert<tinyusdz::value::matrix3d_const&>
                      ((vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>
                        *)result,iVar10,(matrix3d *)local_98);
          }
          else {
            pdVar8 = (double *)local_98;
            for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
              (iVar10._M_current)->m[0][0] = *pdVar8;
              pdVar8 = pdVar8 + (ulong)bVar11 * -2 + 1;
              iVar10._M_current =
                   (matrix3d *)((long)iVar10._M_current + ((ulong)bVar11 * -2 + 1) * 8);
            }
            ppmVar1 = &(result->
                       super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppmVar1 = *ppmVar1 + 1;
          }
          iVar5 = 0;
        }
      }
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      return false;
    }
LAB_003b7dc0:
    if ((result->
        super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>).
        _M_impl.super__Vector_impl_data._M_start !=
        (result->
        super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    local_98._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_98 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Empty array.\n","");
    PushError(this,(string *)local_98);
    local_50.field_2._M_allocated_capacity = local_98._16_8_;
    _Var9._M_p = (pointer)local_98._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_98 + 0x10)) {
      return false;
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Not starting with the value of requested type.\n","");
    PushError(this,&local_50);
    _Var9._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return false;
    }
  }
  operator_delete(_Var9._M_p,local_50.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}